

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O1

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::resize
          (CompressedStorage<double,_int> *this,size_t size,double reserveSizeFactor)

{
  Scalar_conflict *__src;
  ulong uVar1;
  Scalar_conflict *__dest;
  Index *__dest_00;
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  
  if (this->m_allocatedSize < size) {
    auVar3._8_4_ = (int)(size >> 0x20);
    auVar3._0_8_ = size;
    auVar3._12_4_ = 0x45300000;
    dVar4 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) * reserveSizeFactor;
    uVar1 = (ulong)dVar4;
    uVar2 = ((long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1) + size;
    __dest = (Scalar_conflict *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    __dest_00 = (Index *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    __src = this->m_values;
    uVar1 = this->m_size;
    if (uVar2 <= this->m_size) {
      uVar1 = uVar2;
    }
    memcpy(__dest,__src,uVar1 * 8);
    memcpy(__dest_00,this->m_indices,uVar1 << 2);
    if (__src != (Scalar_conflict *)0x0) {
      operator_delete__(__src);
    }
    if (this->m_indices != (Index *)0x0) {
      operator_delete__(this->m_indices);
    }
    this->m_values = __dest;
    this->m_indices = __dest_00;
    this->m_allocatedSize = uVar2;
  }
  this->m_size = size;
  return;
}

Assistant:

void resize(size_t size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
        reallocate(size + size_t(reserveSizeFactor*double(size)));
      m_size = size;
    }